

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

char * server::getdemofile(char *file,bool init)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *path;
  char *dir;
  int dirlen;
  bool init_local;
  char *file_local;
  
  if (*demodir == '\0') {
    file_local = (char *)0x0;
  }
  else {
    copystring(getdemofile::buf,demodir,0x104);
    sVar3 = strlen(getdemofile::buf);
    iVar2 = (int)sVar3;
    if (((getdemofile::buf[iVar2] != '/') && (getdemofile::buf[iVar2] != '\\')) &&
       (iVar2 + 1 < 0x104)) {
      getdemofile::buf[iVar2] = '/';
      getdemofile::buf[iVar2 + 1] = '\0';
    }
    if (init) {
      path = findfile(getdemofile::buf,"w");
      bVar1 = fileexists(path,"w");
      if (!bVar1) {
        createdir(path);
      }
    }
    concatstring(getdemofile::buf,file,0x104);
    file_local = getdemofile::buf;
  }
  return file_local;
}

Assistant:

const char *getdemofile(const char *file, bool init)
    {
        if(!demodir[0]) return NULL;
        static string buf;
        copystring(buf, demodir);
        int dirlen = strlen(buf);
        if(buf[dirlen] != '/' && buf[dirlen] != '\\' && dirlen+1 < (int)sizeof(buf)) { buf[dirlen++] = '/'; buf[dirlen] = '\0'; }
        if(init)
        {
            const char *dir = findfile(buf, "w");
            if(!fileexists(dir, "w")) createdir(dir);
        }
        concatstring(buf, file);
        return buf;
    }